

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

Value * __thiscall choc::value::Value::operator=(Value *this,ValueView *source)

{
  MainType MVar1;
  uint32_t uVar2;
  pointer __dest;
  pointer puVar3;
  pointer pcVar4;
  bool bVar5;
  size_t __new_size;
  StringDictionary *local_20;
  
  MVar1 = (source->type).mainType;
  __new_size = 4;
  if (MVar1 < string) {
    switch(MVar1) {
    case void_:
      __new_size = 0;
      break;
    case boolean:
      __new_size = 1;
      break;
    case ~(complexArray|primitiveArray|vector|int64|int32|boolean):
    case ~(complexArray|primitiveArray|vector|int64|int32):
    case int32|boolean:
    case ~(complexArray|primitiveArray|vector|int64|boolean):
    case ~(complexArray|primitiveArray|vector|int64):
switchD_001dacc3_caseD_2:
      throwError("Invalid type");
    case int32:
      break;
    default:
      if (MVar1 == float32) break;
      if (MVar1 != float64) goto switchD_001dacc3_caseD_2;
    case int64:
      __new_size = 8;
    }
  }
  else if (MVar1 < primitiveArray) {
    if (MVar1 != string) {
      if (MVar1 != vector) goto switchD_001dacc3_caseD_2;
      __new_size = (ulong)(source->type).content.vector.numElements *
                   (ulong)((source->type).content.vector.elementType & 0xf);
    }
  }
  else if (MVar1 == primitiveArray) {
    uVar2 = (source->type).content.primitiveArray.numVectorElements;
    __new_size = (ulong)(source->type).content.vector.numElements *
                 (ulong)((uVar2 + (uVar2 == 0)) * ((source->type).content.vector.elementType & 0xf))
    ;
  }
  else if (MVar1 == complexArray) {
    __new_size = Type::ComplexArray::getValueDataSize((source->type).content.complexArray);
  }
  else {
    if (MVar1 != object) goto switchD_001dacc3_caseD_2;
    __new_size = Type::Object::getValueDataSize((source->type).content.object);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->packedData,__new_size);
  Type::operator=(&(this->value).type,&source->type);
  __dest = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->value).data = __dest;
  memcpy(__dest,source->data,(long)puVar3 - (long)__dest);
  pcVar4 = (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar4) {
    (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  if ((source->stringDictionary != (StringDictionary *)0x0) &&
     ((MVar1 = (source->type).mainType, MVar1 == string ||
      ((MVar1 == object && (bVar5 = Type::Object::usesStrings((source->type).content.object), bVar5)
       ))))) {
    local_20 = source->stringDictionary;
    importStringHandles(choc::value::ValueView&,choc::value::StringDictionary_const&)::
    StringHandleImporter::importStrings(choc::value::ValueView__(&local_20,&this->value);
  }
  return this;
}

Assistant:

inline Value& Value::operator= (const ValueView& source)
{
    packedData.resize (source.getType().getValueDataSize());
    value.type = source.type;
    value.data = packedData.data();
    memcpy (value.data, source.getRawData(), getRawDataSize());
    dictionary.strings.clear();

    if (source.stringDictionary != nullptr && source.getType().usesStrings())
        importStringHandles (value, *source.stringDictionary);

    return *this;
}